

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void t1_dec_sigpass_step_mqc_vsc
               (opj_t1_t *t1,flag_t *flagsp,int *datap,int orient,int oneplushalf,int vsc)

{
  long lVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int in_ECX;
  int *in_RDX;
  ushort *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  opj_mqc_t *mqc;
  int flag;
  int v;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_3c;
  
  lVar1 = *(long *)(in_RDI + 8);
  if (in_R9D == 0) {
    local_3c = (uint)(short)*in_RSI;
  }
  else {
    local_3c = (int)(short)*in_RSI & 0xfffffbb9;
  }
  if (((local_3c & 0xff) != 0) && ((local_3c & 0x5000) == 0)) {
    cVar2 = t1_getctxno_zc(local_3c,in_ECX);
    *(long *)(lVar1 + 0xc0) = lVar1 + 0x28 + (long)(int)cVar2 * 8;
    iVar3 = mqc_decode((opj_mqc_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (iVar3 != 0) {
      cVar2 = t1_getctxno_sc(local_3c);
      *(long *)(lVar1 + 0xc0) = lVar1 + 0x28 + (long)(int)cVar2 * 8;
      uVar4 = mqc_decode((opj_mqc_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
      ;
      cVar2 = t1_getspb(local_3c);
      if ((uVar4 ^ (int)cVar2) != 0) {
        in_R8D = -in_R8D;
      }
      *in_RDX = in_R8D;
      t1_updateflags((flag_t *)in_RSI,uVar4 ^ (int)cVar2,*(int *)(in_RDI + 0x38));
    }
    *in_RSI = *in_RSI | 0x4000;
  }
  return;
}

Assistant:

static INLINE void t1_dec_sigpass_step_mqc_vsc(
		opj_t1_t *t1,
		flag_t *flagsp,
		int *datap,
		int orient,
		int oneplushalf,
		int vsc)
{
	int v, flag;
	
	opj_mqc_t *mqc = t1->mqc;	/* MQC component */
	
	flag = vsc ? ((*flagsp) & (~(T1_SIG_S | T1_SIG_SE | T1_SIG_SW | T1_SGN_S))) : (*flagsp);
	if ((flag & T1_SIG_OTH) && !(flag & (T1_SIG | T1_VISIT))) {
		mqc_setcurctx(mqc, t1_getctxno_zc(flag, orient));
		if (mqc_decode(mqc)) {
			mqc_setcurctx(mqc, t1_getctxno_sc(flag));
			v = mqc_decode(mqc) ^ t1_getspb(flag);
			*datap = v ? -oneplushalf : oneplushalf;
			t1_updateflags(flagsp, v, t1->flags_stride);
		}
		*flagsp |= T1_VISIT;
	}
}